

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

void __thiscall leveldb::Block::Iter::SeekToRestartPoint(Iter *this,uint32_t index)

{
  uint32_t uVar1;
  
  (this->key_)._M_string_length = 0;
  *(this->key_)._M_dataplus._M_p = '\0';
  this->restart_index_ = index;
  uVar1 = GetRestartPoint(this,index);
  (this->value_).data_ = this->data_ + uVar1;
  (this->value_).size_ = 0;
  return;
}

Assistant:

void SeekToRestartPoint(uint32_t index) {
    key_.clear();
    restart_index_ = index;
    // current_ will be fixed by ParseNextKey();

    // ParseNextKey() starts at the end of value_, so set value_ accordingly
    uint32_t offset = GetRestartPoint(index);
    value_ = Slice(data_ + offset, 0);
  }